

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamWriterPrivate::WriteReferences
          (BamWriterPrivate *this,RefVector *referenceSequences)

{
  pointer pRVar1;
  int iVar2;
  uint uVar3;
  pointer pRVar4;
  int32_t referenceLength;
  uint32_t maybeSwappedNameLen;
  uint32_t numReferenceSequences;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  iVar2 = (int)((ulong)((long)(referenceSequences->
                              super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(referenceSequences->
                             super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_34 = iVar2 * -0x33333333;
  if (this->m_isBigEndian == true) {
    local_34 = local_34 >> 0x18 | (local_34 & 0xff0000) >> 8 | (local_34 & 0xff00) << 8 |
               iVar2 * -0x33000000;
  }
  BgzfStream::Write(&this->m_stream,(char *)&local_34,4);
  pRVar4 = (referenceSequences->
           super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pRVar1 = (referenceSequences->
           super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar4 != pRVar1) {
    do {
      uVar3 = (int)(pRVar4->RefName)._M_string_length + 1;
      local_38 = uVar3;
      if (this->m_isBigEndian == true) {
        local_38 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                   uVar3 * 0x1000000;
      }
      BgzfStream::Write(&this->m_stream,(char *)&local_38,4);
      BgzfStream::Write(&this->m_stream,(pRVar4->RefName)._M_dataplus._M_p,(ulong)uVar3);
      local_3c = pRVar4->RefLength;
      if (this->m_isBigEndian == true) {
        local_3c = local_3c << 0x18 | (int)local_3c >> 0x18 | (local_3c & 0xff00) << 8 |
                   local_3c >> 8 & 0xff00;
      }
      BgzfStream::Write(&this->m_stream,(char *)&local_3c,4);
      pRVar4 = pRVar4 + 1;
    } while (pRVar4 != pRVar1);
  }
  return;
}

Assistant:

void BamWriterPrivate::WriteReferences(const BamTools::RefVector& referenceSequences)
{

    // write the number of reference sequences
    uint32_t numReferenceSequences = referenceSequences.size();
    if (m_isBigEndian) BamTools::SwapEndian_32(numReferenceSequences);
    m_stream.Write((char*)&numReferenceSequences, Constants::BAM_SIZEOF_INT);

    // foreach reference sequence
    RefVector::const_iterator rsIter = referenceSequences.begin();
    RefVector::const_iterator rsEnd = referenceSequences.end();
    for (; rsIter != rsEnd; ++rsIter) {

        // write the reference sequence name length (+1 for terminator)
        const uint32_t actualNameLen = rsIter->RefName.size() + 1;
        uint32_t maybeSwappedNameLen = actualNameLen;
        if (m_isBigEndian) BamTools::SwapEndian_32(maybeSwappedNameLen);
        m_stream.Write((char*)&maybeSwappedNameLen, Constants::BAM_SIZEOF_INT);

        // write the reference sequence name
        m_stream.Write(rsIter->RefName.c_str(), actualNameLen);

        // write the reference sequence length
        int32_t referenceLength = rsIter->RefLength;
        if (m_isBigEndian) BamTools::SwapEndian_32(referenceLength);
        m_stream.Write((char*)&referenceLength, Constants::BAM_SIZEOF_INT);
    }
}